

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O2

uint32_t phf_round32(uchar *p,size_t n,uint32_t h1)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  
  puVar4 = p + 3;
  do {
    uVar3 = 0;
    uVar2 = 0;
    switch(n) {
    case 0:
      return h1;
    case 3:
      uVar2 = (uint)puVar4[-1] << 8;
    case 2:
      uVar3 = uVar2 | (uint)puVar4[-2] << 0x10;
    case 1:
      uVar1 = phf_round32((uint)puVar4[-3] << 0x18 | uVar3,h1);
      return uVar1;
    default:
      uVar2 = *(uint *)(puVar4 + -3);
      h1 = phf_round32(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                       uVar2 << 0x18,h1);
      n = n - 4;
      puVar4 = puVar4 + 4;
    }
  } while( true );
}

Assistant:

static inline uint32_t phf_round32(const unsigned char *p, size_t n, uint32_t h1) {
	uint32_t k1;

	while (n >= 4) {
		k1 = (p[0] << 24)
		   | (p[1] << 16)
		   | (p[2] << 8)
		   | (p[3] << 0);

		h1 = phf_round32(k1, h1);

		p += 4;
		n -= 4;
	}

	k1 = 0;

	switch (n & 3) {
	case 3:
		k1 |= p[2] << 8;
	case 2:
		k1 |= p[1] << 16;
	case 1:
		k1 |= p[0] << 24;
		h1 = phf_round32(k1, h1);
	}

	return h1;
}